

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * __thiscall
String::format<1024ul>(String *__return_storage_ptr__,String *this,char *format,__va_list_tag *args)

{
  int iVar1;
  ulong len;
  char *__s;
  size_t size;
  char buffer [1024];
  va_list copy;
  __va_list_tag *args_local;
  char *format_local;
  String *ret;
  
  buffer._1016_8_ = *(undefined8 *)format;
  iVar1 = vsnprintf((char *)&size,0x400,(char *)this,format);
  len = (ulong)iVar1;
  String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  if (len < 0x400) {
    assign(__return_storage_ptr__,(char *)&size,len);
  }
  else {
    resize(__return_storage_ptr__,len);
    __s = operator[](__return_storage_ptr__,0);
    vsnprintf(__s,len + 1,(char *)this,buffer + 0x3f8);
  }
  return __return_storage_ptr__;
}

Assistant:

static String format(const char *format, va_list args)
    {
        va_list copy;
        va_copy(copy, args);

        char buffer[StaticBufSize];
        const size_t size = ::vsnprintf(buffer, StaticBufSize, format, args);
        assert(size >= 0);
        String ret;
        if (size < StaticBufSize) {
            ret.assign(buffer, size);
        } else {
            ret.resize(size);
            ::vsnprintf(&ret[0], size+1, format, copy);
        }
        va_end(copy);
        return ret;
    }